

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalUpdateCounts(Fts3Expr *pExpr,int nCol)

{
  u32 *puVar1;
  u32 *puVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (; pExpr != (Fts3Expr *)0x0; pExpr = pExpr->pRight) {
    if ((pExpr->pPhrase != (Fts3Phrase *)0x0) &&
       (pbVar8 = (byte *)(pExpr->pPhrase->doclist).pList, pbVar8 != (byte *)0x0)) {
      uStack_38 = uStack_38 & 0xffffffff;
      puVar2 = pExpr->aMI;
      do {
        bVar6 = *pbVar8;
        iVar3 = 0;
        if (1 < bVar6) {
          iVar3 = 0;
          bVar7 = 0;
          do {
            iVar3 = iVar3 + (uint)(bVar7 == 0);
            bVar7 = bVar6 & 0x80;
            bVar6 = pbVar8[1];
            pbVar8 = pbVar8 + 1;
          } while ((bVar6 & 0xfe) != 0 || bVar7 != 0);
        }
        puVar1 = puVar2 + (long)uStack_38._4_4_ * 3 + 1;
        *puVar1 = *puVar1 + iVar3;
        puVar1 = puVar2 + (long)uStack_38._4_4_ * 3 + 2;
        *puVar1 = (*puVar1 + 1) - (uint)(iVar3 == 0);
        bVar6 = *pbVar8;
        if (bVar6 != 0) {
          if ((char)pbVar8[1] < '\0') {
            uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar8 + 1),(int *)((long)&uStack_38 + 4));
            uVar5 = (ulong)uVar4;
          }
          else {
            uStack_38 = CONCAT44((int)(char)pbVar8[1],(undefined4)uStack_38);
            uVar5 = 1;
          }
          pbVar8 = pbVar8 + 1 + uVar5;
        }
      } while ((bVar6 != 0) && (uStack_38._4_4_ < nCol));
    }
    fts3EvalUpdateCounts(pExpr->pLeft,nCol);
  }
  return;
}

Assistant:

static void fts3EvalUpdateCounts(Fts3Expr *pExpr, int nCol){
  if( pExpr ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;
    if( pPhrase && pPhrase->doclist.pList ){
      int iCol = 0;
      char *p = pPhrase->doclist.pList;

      do{
        u8 c = 0;
        int iCnt = 0;
        while( 0xFE & (*p | c) ){
          if( (c&0x80)==0 ) iCnt++;
          c = *p++ & 0x80;
        }

        /* aMI[iCol*3 + 1] = Number of occurrences
        ** aMI[iCol*3 + 2] = Number of rows containing at least one instance
        */
        pExpr->aMI[iCol*3 + 1] += iCnt;
        pExpr->aMI[iCol*3 + 2] += (iCnt>0);
        if( *p==0x00 ) break;
        p++;
        p += fts3GetVarint32(p, &iCol);
      }while( iCol<nCol );
    }

    fts3EvalUpdateCounts(pExpr->pLeft, nCol);
    fts3EvalUpdateCounts(pExpr->pRight, nCol);
  }
}